

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O3

DString * d_string_new(char *startingString)

{
  ulong uVar1;
  DString *__ptr;
  size_t __n;
  char *__dest;
  ulong __size;
  char *__s;
  
  __ptr = (DString *)malloc(0x18);
  if (__ptr != (DString *)0x0) {
    __s = "";
    if (startingString != (char *)0x0) {
      __s = startingString;
    }
    __n = strlen(__s);
    uVar1 = 0x400;
    do {
      __size = uVar1;
      uVar1 = __size * 2;
    } while (__size < __n + 1);
    __dest = (char *)malloc(__size);
    __ptr->str = __dest;
    if (__dest != (char *)0x0) {
      __ptr->currentStringBufferSize = __size;
      strncpy(__dest,__s,__n);
      __dest[__n] = '\0';
      __ptr->currentStringLength = __n;
      return __ptr;
    }
    free(__ptr);
  }
  return (DString *)0x0;
}

Assistant:

DString * d_string_new(const char * startingString) {
	DString * newString = malloc(sizeof(DString));

	if (!newString) {
		return NULL;
	}

	if (startingString == NULL) {
		startingString = "";
	}

	size_t startingBufferSize = kStringBufferStartingSize;
	size_t startingStringSize = strlen(startingString);

	while (startingBufferSize < (startingStringSize + 1)) {
		startingBufferSize *= kStringBufferGrowthMultiplier;
	}

	newString->str = malloc(startingBufferSize);

	if (!newString->str) {
		free(newString);
		return NULL;
	}

	newString->currentStringBufferSize = startingBufferSize;
	strncpy(newString->str, startingString, startingStringSize);
	newString->str[startingStringSize] = '\0';
	newString->currentStringLength = startingStringSize;

	return newString;
}